

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_bytes.cpp
# Opt level: O2

void duckdb::FormatBytesFunction<1024l>(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  anon_union_16_2_67f50693_for_value *paVar1;
  long *plVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *dataptr;
  reference vector;
  ulong uVar6;
  idx_t iVar7;
  reference pvVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  idx_t extraout_RDX;
  unsigned_long *extraout_RDX_00;
  _Head_base<0UL,_unsigned_long_*,_false> idx;
  idx_t extraout_RDX_01;
  idx_t idx_00;
  ulong uVar10;
  idx_t iVar11;
  element_type *peVar12;
  ulong uVar13;
  element_type *peVar14;
  data_ptr_t pdVar15;
  idx_t *piVar16;
  ulong uVar17;
  idx_t iVar18;
  ulong uVar19;
  string_t sVar20;
  anon_struct_16_3_d7536bce_for_pointer aVar21;
  ValidityMask local_a8;
  ulong local_88;
  data_ptr_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  local_a8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)result;
  if (vector->vector_type == FLAT_VECTOR) {
    pvVar8 = vector;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar15 = result->data;
    pdVar4 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar16 = (idx_t *)(pdVar15 + 8);
      iVar18 = extraout_RDX;
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        sVar20 = UnaryLambdaWrapper::
                 Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                           (*(long *)(pdVar4 + iVar11 * 8),&local_a8,iVar18,pvVar8);
        iVar18 = sVar20.value._8_8_;
        piVar16[-1] = sVar20.value._0_8_;
        *piVar16 = iVar18;
        piVar16 = piVar16 + 2;
      }
    }
    else {
      other = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&vector->validity;
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 (TemplatedValidityMask<unsigned_long> *)other);
      local_88 = count + 0x3f >> 6;
      peVar14 = (element_type *)(pdVar15 + 8);
      idx._M_head_impl = extraout_RDX_00;
      uVar17 = 0;
      local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar14;
      local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = other;
      for (uVar13 = 0; uVar13 != local_88; uVar13 = uVar13 + 1) {
        puVar3 = ((TemplatedValidityMask<unsigned_long> *)&other->_vptr__Sp_counted_base)->
                 validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar10 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar10 = count;
          }
LAB_01d833dc:
          peVar12 = peVar14 + uVar17 * 2;
          for (; uVar6 = uVar17,
              _Var9._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                            internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi, uVar17 < uVar10; uVar17 = uVar17 + 1) {
            sVar20 = UnaryLambdaWrapper::
                     Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                               (*(long *)(pdVar4 + uVar17 * 8),&local_a8,(idx_t)idx._M_head_impl,
                                other);
            idx._M_head_impl = sVar20.value._8_8_;
            peVar12[-1].owned_data.
            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false> = (unsigned_long *)sVar20.value._0_8_;
            (peVar12->owned_data).
            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false> =
                 (_Head_base<0UL,_unsigned_long_*,_false>)idx._M_head_impl;
            peVar12 = peVar12 + 2;
          }
        }
        else {
          uVar5 = puVar3[uVar13];
          uVar10 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar10 = count;
          }
          peVar14 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          if (uVar5 == 0xffffffffffffffff) goto LAB_01d833dc;
          uVar6 = uVar10;
          _Var9._M_pi = other;
          if (uVar5 != 0) {
            peVar12 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + uVar17 * 2;
            local_80 = pdVar4 + uVar17 * 8;
            local_a8.super_TemplatedValidityMask<unsigned_long>.capacity = uVar13;
            for (uVar19 = 0; uVar6 = uVar17 + uVar19,
                _Var9._M_pi = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                              internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,
                uVar13 = local_a8.super_TemplatedValidityMask<unsigned_long>.capacity,
                peVar14 = local_a8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                          .
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr, uVar17 + uVar19 < uVar10; uVar19 = uVar19 + 1) {
              if ((uVar5 >> (uVar19 & 0x3f) & 1) != 0) {
                sVar20 = UnaryLambdaWrapper::
                         Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                                   (*(long *)(local_80 + uVar19 * 8),&local_a8,
                                    (idx_t)idx._M_head_impl,other);
                idx._M_head_impl = sVar20.value._8_8_;
                peVar12[-1].owned_data.
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false> =
                     ((unsigned_long *)sVar20.value._0_8_)._M_head_impl;
                (peVar12->owned_data).
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false> =
                     (_Head_base<0UL,_unsigned_long_*,_false>)idx._M_head_impl;
              }
              peVar12 = peVar12 + 2;
            }
          }
        }
        other = _Var9._M_pi;
        uVar17 = uVar6;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    pvVar8 = vector;
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar1 = (anon_union_16_2_67f50693_for_value *)result->data;
    plVar2 = (long *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar21 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapper::
             Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                       (*plVar2,&local_a8,idx_00,pvVar8);
    paVar1->pointer = aVar21;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar15 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      piVar16 = (idx_t *)(pdVar15 + 8);
      iVar18 = extraout_RDX_01;
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        dataptr = (local_78.sel)->sel_vector;
        iVar7 = iVar11;
        if (dataptr != (sel_t *)0x0) {
          iVar7 = (idx_t)dataptr[iVar11];
        }
        sVar20 = UnaryLambdaWrapper::
                 Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                           (*(long *)(local_78.data + iVar7 * 8),&local_a8,iVar18,dataptr);
        iVar18 = sVar20.value._8_8_;
        piVar16[-1] = sVar20.value._0_8_;
        *piVar16 = iVar18;
        piVar16 = piVar16 + 2;
      }
    }
    else {
      pdVar15 = pdVar15 + 8;
      for (iVar18 = 0; count != iVar18; iVar18 = iVar18 + 1) {
        iVar11 = iVar18;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)(local_78.sel)->sel_vector[iVar18];
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar18);
        }
        else {
          sVar20 = UnaryLambdaWrapper::
                   Operation<duckdb::FormatBytesFunction<1024l>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(long)_1_,long,duckdb::string_t>
                             (*(long *)(local_78.data + iVar11 * 8),&local_a8,iVar11 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[iVar11 >> 6]);
          *(long *)(pdVar15 + -8) = sVar20.value._0_8_;
          *(long *)pdVar15 = sVar20.value._8_8_;
        }
        pdVar15 = pdVar15 + 0x10;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void FormatBytesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<int64_t, string_t>(args.data[0], result, args.size(), [&](int64_t bytes) {
		bool is_negative = bytes < 0;
		idx_t unsigned_bytes;
		if (bytes < 0) {
			if (bytes == NumericLimits<int64_t>::Minimum()) {
				unsigned_bytes = idx_t(NumericLimits<int64_t>::Maximum()) + 1;
			} else {
				unsigned_bytes = idx_t(-bytes);
			}
		} else {
			unsigned_bytes = idx_t(bytes);
		}
		return StringVector::AddString(result, (is_negative ? "-" : "") +
		                                           StringUtil::BytesToHumanReadableString(unsigned_bytes, MULTIPLIER));
	});
}